

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

void __thiscall Matrix::Matrix(Matrix *this,Permutation *permutation)

{
  pointer pvVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int i;
  long lVar5;
  allocator_type local_4a;
  allocator_type local_49;
  _Vector_base<Fraction,_std::allocator<Fraction>_> local_48;
  
  iVar2 = Permutation::Size(permutation);
  this->n_ = iVar2;
  iVar2 = Permutation::Size(permutation);
  this->m_ = iVar2;
  iVar2 = Permutation::Size(permutation);
  iVar3 = Permutation::Size(permutation);
  std::vector<Fraction,_std::allocator<Fraction>_>::vector
            ((vector<Fraction,_std::allocator<Fraction>_> *)&local_48,(long)iVar3,&local_49);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::vector(&this->elements_,(long)iVar2,(value_type *)&local_48,&local_4a);
  std::_Vector_base<Fraction,_std::allocator<Fraction>_>::~_Vector_base(&local_48);
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < this->n_; lVar5 = lVar5 + 1) {
    Fraction::Fraction((Fraction *)&local_48,1);
    pvVar1 = (this->elements_).
             super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = Permutation::At(permutation,(int)lVar5);
    *(pointer *)
     (*(long *)((long)&(pvVar1->super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                       super__Vector_impl_data + lVar4) + (long)iVar2 * 8) =
         local_48._M_impl.super__Vector_impl_data._M_start;
    lVar4 = lVar4 + 0x18;
  }
  return;
}

Assistant:

Matrix::Matrix(const Permutation& permutation)
    : n_(permutation.Size()), m_(permutation.Size()),
      elements_(std::vector<std::vector<Fraction>>(
          permutation.Size(), std::vector<Fraction>(permutation.Size()))) {
  for (int i = 0; i < n_; i++) {
    elements_[i][permutation.At(i)] = 1;
  }
}